

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIFT.cpp
# Opt level: O0

void buildDoGPyramid(vector<std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_std::allocator<std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
                     *scaleSpace,
                    vector<std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_std::allocator<std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
                    *dogScaleSpace)

{
  const_reference pvVar1;
  const_reference pvVar2;
  Mat local_200 [3];
  undefined1 local_a0 [8];
  Mat tmp;
  undefined1 local_38 [4];
  int j;
  vector<cv::Mat,_std::allocator<cv::Mat>_> tmpDogScale;
  int i;
  vector<std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_std::allocator<std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
  *dogScaleSpace_local;
  vector<std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_std::allocator<std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
  *scaleSpace_local;
  
  for (tmpDogScale.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      tmpDogScale.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ < 4;
      tmpDogScale.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           tmpDogScale.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector
              ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_38);
    for (tmp.step.buf[1]._4_4_ = 0; tmp.step.buf[1]._4_4_ < 4;
        tmp.step.buf[1]._4_4_ = tmp.step.buf[1]._4_4_ + 1) {
      pvVar1 = std::
               vector<std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_std::allocator<std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
               ::operator[](scaleSpace,
                            (long)(int)tmpDogScale.
                                       super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl
                                       .super__Vector_impl_data._M_end_of_storage._4_4_);
      pvVar2 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                         (pvVar1,(long)(int)(tmp.step.buf[1]._4_4_ + 1));
      pvVar1 = std::
               vector<std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_std::allocator<std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
               ::operator[](scaleSpace,
                            (long)(int)tmpDogScale.
                                       super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl
                                       .super__Vector_impl_data._M_end_of_storage._4_4_);
      std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                (pvVar1,(long)(int)tmp.step.buf[1]._4_4_);
      cv::operator-(local_200,pvVar2);
      cv::MatExpr::operator_cast_to_Mat((Mat *)local_a0,(MatExpr *)local_200);
      cv::MatExpr::~MatExpr((MatExpr *)local_200);
      std::vector<cv::Mat,_std::allocator<cv::Mat>_>::push_back
                ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_38,(value_type *)local_a0);
      cv::Mat::~Mat((Mat *)local_a0);
    }
    std::
    vector<std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_std::allocator<std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
    ::push_back(dogScaleSpace,(value_type *)local_38);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector
              ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_38);
  }
  return;
}

Assistant:

void buildDoGPyramid(const vector<vector<Mat> >& scaleSpace, vector<vector<Mat> >& dogScaleSpace){
    for(int i=0; i<octave; i++){
        vector<Mat> tmpDogScale;
        for(int j=0; j<octaveLayer-1; j++){
            Mat tmp = scaleSpace[i][j+1] - scaleSpace[i][j];
            // sharpen2(tmp,tmp);
            tmpDogScale.push_back(tmp);
        }
        dogScaleSpace.push_back(tmpDogScale);
    }
}